

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Node * __thiscall JSON::Parser::parseArrayExpression(Node *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  bool bVar2;
  vector<JSON::Node,_std::allocator<JSON::Node>_> local_e8;
  string local_d0 [39];
  undefined1 local_a9;
  Node local_a8;
  undefined1 local_38 [8];
  vector<JSON::Node,_std::allocator<JSON::Node>_> elements;
  int startPos;
  bool hasTailComma;
  Parser *this_local;
  Node *node;
  
  elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = (this->currentToken).start;
  expect(this,BRACKETS_START);
  next(this);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector
            ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_38);
  do {
    while( true ) {
      bVar1 = isValidPos(this);
      bVar2 = false;
      if (bVar1) {
        bVar2 = (this->currentToken).type != BRACKETS_END;
      }
      if (!bVar2) goto LAB_00107090;
      elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      parseNode(&local_a8,this);
      std::vector<JSON::Node,_std::allocator<JSON::Node>_>::push_back
                ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_38,&local_a8);
      Node::~Node(&local_a8);
      if ((this->currentToken).type != COMMA) break;
      elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      next(this);
    }
  } while ((this->currentToken).type == BRACKETS_END);
LAB_00107090:
  if ((elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    unexpected(this,&this->lastToken);
  }
  expect(this,BRACKETS_END);
  local_a9 = 0;
  std::__cxx11::string::string(local_d0,(string *)NodeType::ArrayExpression_abi_cxx11_);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::vector
            (&local_e8,(vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_38);
  Node::Node(__return_storage_ptr__,(string *)local_d0,&local_e8,
             (int)elements.super__Vector_base<JSON::Node,_std::allocator<JSON::Node>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(this->currentToken).end);
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector(&local_e8);
  std::__cxx11::string::~string(local_d0);
  next(this);
  local_a9 = 1;
  std::vector<JSON::Node,_std::allocator<JSON::Node>_>::~vector
            ((vector<JSON::Node,_std::allocator<JSON::Node>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

Node Parser::parseArrayExpression() {
        bool hasTailComma = false;
        int startPos = currentToken.start;
        expect(BRACKETS_START);
        next();
        vector<Node> elements;

        while (isValidPos() && currentToken.type != BRACKETS_END) {
            hasTailComma = false;
            elements.push_back(parseNode());

            // end of element
            if (currentToken.type == COMMA) {
                hasTailComma = true;
                next();
            } else if (currentToken.type != BRACKETS_END) {
                break;
            }
        }

        if (hasTailComma) {
            unexpected(lastToken);
        }

        expect(BRACKETS_END);
        Node node(NodeType::ArrayExpression, elements, startPos, currentToken.end);
        next();

        return node;
    }